

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O0

void cfd::core::logger::log<int&,int&,unsigned_int&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,int *args,int *args_1,
               uint *args_2)

{
  bool bVar1;
  string_view format_str;
  format_args args_00;
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  uint *args_local_2;
  int *args_local_1;
  int *args_local;
  char *fmt_local;
  CfdSourceLocation *pCStack_c0;
  CfdLogLevel lvl_local;
  CfdSourceLocation *source_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_b0;
  basic_string_view<char> local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_int,_unsigned_int>
  local_98;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_int,_unsigned_int>
  *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_int,_unsigned_int>
  *vargs;
  int *local_50;
  int *local_48;
  v7 *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_int,_unsigned_int>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_int,_unsigned_int>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_int,_unsigned_int>
  *local_10;
  
  message.field_2._8_8_ = args_2;
  args_local = (int *)fmt;
  fmt_local._4_4_ = lvl;
  pCStack_c0 = source;
  bVar1 = IsEnableLogLevel(lvl);
  if (bVar1) {
    local_40 = (v7 *)&args_local;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_int,_unsigned_int>
             *)message.field_2._8_8_;
    local_50 = args_1;
    local_48 = args;
    local_38 = (string *)local_108;
    ::fmt::v7::make_args_checked<int&,int&,unsigned_int&,char_const*,char>
              (&local_98,local_40,(char **)args,args_1,
               (remove_reference_t<int_&> *)message.field_2._8_8_,args_2);
    local_60 = &local_98;
    local_a8 = ::fmt::v7::to_string_view<char,_0>(*(char **)local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&source_local;
    local_30 = local_60;
    local_20 = local_60;
    local_10 = local_60;
    local_18 = local_28;
    ::fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0x211,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_60);
    format_str.size_ = (size_t)source_local;
    format_str.data_ = (char *)local_a8.size_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         args_2;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_b0.values_;
    ::fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_108,(detail *)local_a8.data_,format_str,args_00);
    WriteLog(pCStack_c0,fmt_local._4_4_,(string *)local_108);
    ::std::__cxx11::string::~string((string *)local_108);
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}